

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

DynamicFormat * get_format(string *name,string_view data,string *file_name)

{
  bool bVar1;
  runtime_error *prVar2;
  string_view name_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  __sv_type local_a0;
  span<const_char,_18446744073709551615UL> local_90;
  DynamicFormat *local_80;
  DynamicFormat *format_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  __sv_type local_48;
  DynamicFormat *local_38;
  DynamicFormat *format;
  string *file_name_local;
  string *name_local;
  string_view data_local;
  
  data_local._M_len = (size_t)data._M_str;
  name_local = (string *)data._M_len;
  format = (DynamicFormat *)file_name;
  file_name_local = name;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (name);
  if (bVar1) {
    std::span<const_char,_18446744073709551615UL>::
    span<std::basic_string_view<char,_std::char_traits<char>_>_&>
              (&local_90,(basic_string_view<char,_std::char_traits<char>_> *)&name_local);
    local_a0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)format);
    local_80 = ritobin::io::DynamicFormat::guess(local_90,local_a0);
    data_local._M_str = (char *)local_80;
    if (local_80 == (DynamicFormat *)0x0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_c0,"Failed to guess format for file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)format);
      std::runtime_error::runtime_error(prVar2,(string *)&local_c0);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    local_48 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)file_name_local);
    name_00._M_str = local_48._M_str;
    name_00._M_len = (size_t)name_00._M_str;
    local_38 = ritobin::io::DynamicFormat::get((DynamicFormat *)local_48._M_len,name_00);
    data_local._M_str = (char *)local_38;
    if (local_38 == (DynamicFormat *)0x0) {
      format_1._3_1_ = 1;
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_68,"Format not found: ",file_name_local);
      std::runtime_error::runtime_error(prVar2,(string *)&local_68);
      format_1._3_1_ = 0;
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return (DynamicFormat *)data_local._M_str;
}

Assistant:

static DynamicFormat const* get_format(std::string const& name, std::string_view data, std::string const& file_name) {
    if (!name.empty()) {
        auto format = DynamicFormat::get(name);
        if (!format) {
            throw std::runtime_error("Format not found: " + name);
        }
        return format;
    } else {
        auto format = DynamicFormat::guess(data, file_name);
        if (!format) {
            throw std::runtime_error("Failed to guess format for file: " + file_name);
        }
        return format;
    }
}